

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

void __thiscall icu_63::LocDataParser::parseError(LocDataParser *this,char *param_1)

{
  UBool UVar1;
  UChar *pUVar2;
  UChar *local_30;
  UChar *limit;
  UChar *x;
  UChar *start;
  char *param_1_local;
  LocDataParser *this_local;
  
  if (this->data != (UChar *)0x0) {
    x = this->p + -0x11;
    if (x < this->data) {
      x = this->data;
    }
    pUVar2 = this->p;
    do {
      limit = pUVar2;
      pUVar2 = limit + -1;
      if (pUVar2 < x) goto LAB_00261e53;
    } while (*pUVar2 != L'\0');
    x = limit;
LAB_00261e53:
    local_30 = this->p + 0xf;
    if (this->e < local_30) {
      local_30 = this->e;
    }
    u_strncpy_63(this->pe->preContext,x,(int32_t)((long)this->p - (long)x >> 1));
    this->pe->preContext[(long)this->p - (long)x >> 1] = L'\0';
    u_strncpy_63(this->pe->postContext,this->p,(int32_t)((long)local_30 - (long)this->p >> 1));
    this->pe->postContext[(long)local_30 - (long)this->p >> 1] = L'\0';
    this->pe->offset = (int32_t)((long)this->p - (long)this->data >> 1);
    uprv_free_63(this->data);
    this->data = (UChar *)0x0;
    this->p = (UChar *)0x0;
    this->e = (UChar *)0x0;
    UVar1 = ::U_SUCCESS(*this->ec);
    if (UVar1 != '\0') {
      *this->ec = U_PARSE_ERROR;
    }
  }
  return;
}

Assistant:

void LocDataParser::parseError(const char* EXPLANATION_ARG)
{
    if (!data) {
        return;
    }

    const UChar* start = p - U_PARSE_CONTEXT_LEN - 1;
    if (start < data) {
        start = data;
    }
    for (UChar* x = p; --x >= start;) {
        if (!*x) {
            start = x+1;
            break;
        }
    }
    const UChar* limit = p + U_PARSE_CONTEXT_LEN - 1;
    if (limit > e) {
        limit = e;
    }
    u_strncpy(pe.preContext, start, (int32_t)(p-start));
    pe.preContext[p-start] = 0;
    u_strncpy(pe.postContext, p, (int32_t)(limit-p));
    pe.postContext[limit-p] = 0;
    pe.offset = (int32_t)(p - data);
    
#ifdef RBNF_DEBUG
    fprintf(stderr, "%s at or near character %ld: ", EXPLANATION_ARG, p-data);

    UnicodeString msg;
    msg.append(start, p - start);
    msg.append((UChar)0x002f); /* SOLIDUS/SLASH */
    msg.append(p, limit-p);
    msg.append(UNICODE_STRING_SIMPLE("'"));
    
    char buf[128];
    int32_t len = msg.extract(0, msg.length(), buf, 128);
    if (len >= 128) {
        buf[127] = 0;
    } else {
        buf[len] = 0;
    }
    fprintf(stderr, "%s\n", buf);
    fflush(stderr);
#endif
    
    uprv_free(data);
    data = NULL;
    p = NULL;
    e = NULL;
    
    if (U_SUCCESS(ec)) {
        ec = U_PARSE_ERROR;
    }
}